

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBuffer.c
# Opt level: O0

ZyanStatus
ZydisFormatterBufferGetToken(ZydisFormatterBuffer *buffer,ZydisFormatterTokenConst **token)

{
  ZydisFormatterTokenConst **token_local;
  ZydisFormatterBuffer *buffer_local;
  
  if ((buffer == (ZydisFormatterBuffer *)0x0) || (token == (ZydisFormatterTokenConst **)0x0)) {
    buffer_local._4_4_ = 0x80100004;
  }
  else {
    *token = (ZydisFormatterTokenConst *)((long)(buffer->string).vector.data + -2);
    if ((*token)->type == '\0') {
      buffer_local._4_4_ = 0x80100005;
    }
    else {
      buffer_local._4_4_ = 0x100000;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

ZyanStatus ZydisFormatterBufferGetToken(const ZydisFormatterBuffer* buffer,
    ZydisFormatterTokenConst** token)
{
    if (!buffer || !token)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    *token = ((ZydisFormatterTokenConst*)buffer->string.vector.data - 1);
    if ((*token)->type == ZYDIS_TOKEN_INVALID)
    {
        return ZYAN_STATUS_INVALID_OPERATION;
    }

    return ZYAN_STATUS_SUCCESS;
}